

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  ImRect *this;
  float fVar1;
  ImGuiWindow *window;
  ImGuiOldColumns *pIVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiID id;
  int iVar9;
  ImGuiOldColumns *pIVar10;
  ImGuiOldColumnData *pIVar11;
  ImGuiOldColumnData *pIVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ImGuiContext *g;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  
  pIVar8 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  id = GetColumnsID(str_id,columns_count);
  pIVar10 = FindOrCreateColumns(window,id);
  pIVar10->Current = 0;
  pIVar10->Count = columns_count;
  pIVar10->Flags = flags;
  (window->DC).CurrentColumns = pIVar10;
  iVar13 = columns_count + 1;
  pIVar10->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar10->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar7 = (window->ClipRect).Max;
  (pIVar10->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar10->HostInitialClipRect).Max = IVar7;
  IVar7 = (window->ParentWorkRect).Max;
  (pIVar10->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar10->HostBackupParentWorkRect).Max = IVar7;
  IVar7 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar7;
  fVar17 = (window->WindowPadding).x;
  fVar1 = (pIVar8->Style).ItemSpacing.x;
  fVar4 = fVar17 * 0.5;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)window->WindowBorderSize),ZEXT416((uint)fVar4),2);
  bVar6 = (bool)((byte)uVar5 & 1);
  fVar19 = (window->WorkRect).Max.x;
  fVar17 = fVar1 - fVar17;
  uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar17),2);
  auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(float)((uint)bVar6 * (int)fVar4 +
                                                   (uint)!bVar6 * (int)window->WindowBorderSize)));
  fVar17 = (float)((uint)((byte)uVar5 & 1) * (int)fVar17);
  auVar3 = vminss_avx(ZEXT416((uint)((fVar1 + fVar19) - fVar17)),
                      ZEXT416((uint)(fVar19 + auVar3._0_4_)));
  fVar17 = fVar17 + ((window->DC).Indent.x - fVar1);
  pIVar10->OffMinX = fVar17;
  fVar17 = fVar17 + 1.0;
  fVar19 = auVar3._0_4_ - (window->Pos).x;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar17),ZEXT416((uint)fVar19),2);
  bVar6 = (bool)((byte)uVar5 & 1);
  pIVar10->OffMaxX = (float)((uint)bVar6 * (int)fVar19 + (uint)!bVar6 * (int)fVar17);
  fVar17 = (window->DC).CursorPos.y;
  pIVar10->LineMaxY = fVar17;
  pIVar10->LineMinY = fVar17;
  iVar16 = (pIVar10->Columns).Size;
  if (iVar16 == iVar13 || iVar16 == 0) {
    pIVar10->IsFirstFrame = iVar16 == 0;
    if (iVar16 == 0) {
      iVar16 = (pIVar10->Columns).Capacity;
      goto LAB_002e3adc;
    }
  }
  else {
    iVar16 = (pIVar10->Columns).Capacity;
    if (iVar16 < 0) {
      iVar16 = 0;
      pIVar11 = (ImGuiOldColumnData *)MemAlloc(0);
      pIVar12 = (pIVar10->Columns).Data;
      if (pIVar12 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar11,pIVar12,(long)(pIVar10->Columns).Size * 0x1c);
        MemFree((pIVar10->Columns).Data);
      }
      (pIVar10->Columns).Data = pIVar11;
      (pIVar10->Columns).Capacity = 0;
    }
    (pIVar10->Columns).Size = 0;
    pIVar10->IsFirstFrame = true;
LAB_002e3adc:
    if (iVar16 <= columns_count) {
      pIVar11 = (ImGuiOldColumnData *)MemAlloc((long)iVar13 * 0x1c);
      pIVar12 = (pIVar10->Columns).Data;
      if (pIVar12 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar11,pIVar12,(long)(pIVar10->Columns).Size * 0x1c);
        MemFree((pIVar10->Columns).Data);
      }
      (pIVar10->Columns).Data = pIVar11;
      (pIVar10->Columns).Capacity = iVar13;
    }
    if (columns_count < 0) goto LAB_002e3d0b;
    iVar16 = (pIVar10->Columns).Size;
    iVar14 = 0;
    do {
      if (iVar16 == (pIVar10->Columns).Capacity) {
        if (iVar16 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar16 / 2 + iVar16;
        }
        iVar15 = iVar16 + 1;
        if (iVar16 + 1 < iVar9) {
          iVar15 = iVar9;
        }
        pIVar12 = (ImGuiOldColumnData *)MemAlloc((long)iVar15 * 0x1c);
        pIVar11 = (pIVar10->Columns).Data;
        if (pIVar11 != (ImGuiOldColumnData *)0x0) {
          memcpy(pIVar12,pIVar11,(long)(pIVar10->Columns).Size * 0x1c);
          MemFree((pIVar10->Columns).Data);
        }
        (pIVar10->Columns).Data = pIVar12;
        (pIVar10->Columns).Capacity = iVar15;
        iVar16 = (pIVar10->Columns).Size;
      }
      else {
        pIVar12 = (pIVar10->Columns).Data;
      }
      fVar17 = (float)iVar14;
      iVar14 = iVar14 + 1;
      pIVar12[iVar16].OffsetNorm = fVar17 / (float)columns_count;
      pIVar11 = pIVar12 + iVar16;
      pIVar11->OffsetNormBeforeResize = 0.0;
      pIVar11->Flags = 0;
      (((ImRect *)(&pIVar11->OffsetNormBeforeResize + 2))->Min).x = 0.0;
      (((ImRect *)(&pIVar11->OffsetNormBeforeResize + 2))->Min).y = 0.0;
      pIVar12[iVar16].ClipRect.Max.x = 0.0;
      pIVar12[iVar16].ClipRect.Max.y = 0.0;
      iVar16 = (pIVar10->Columns).Size + 1;
      (pIVar10->Columns).Size = iVar16;
    } while (iVar13 != iVar14);
  }
  if (0 < columns_count) {
    iVar16 = 0;
    do {
      pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar2 == (ImGuiOldColumns *)0x0) {
        fVar17 = 0.0;
        fVar19 = 0.0;
      }
      else {
        fVar19 = pIVar2->OffMinX;
        pIVar12 = (pIVar2->Columns).Data;
        auVar18 = ZEXT416((uint)(pIVar2->OffMaxX - fVar19));
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)pIVar12[iVar16].OffsetNorm),auVar18,
                                 ZEXT416((uint)fVar19));
        fVar17 = auVar3._0_4_;
        auVar3 = vfmadd231ss_fma(ZEXT416((uint)fVar19),auVar18,
                                 ZEXT416((uint)pIVar12[iVar16 + 1].OffsetNorm));
        fVar19 = auVar3._0_4_;
      }
      iVar13 = iVar16 + 1;
      fVar4 = (window->Pos).x;
      this = &(pIVar10->Columns).Data[iVar16].ClipRect;
      auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar4 + fVar17 + 0.5)));
      (this->Min).x = auVar3._0_4_;
      (this->Min).y = -3.4028235e+38;
      auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar4 + fVar19 + -1.0 + 0.5)));
      (this->Max).x = auVar3._0_4_;
      (this->Max).y = 3.4028235e+38;
      ImRect::ClipWithFull(this,&window->ClipRect);
      iVar16 = iVar13;
    } while (iVar13 < columns_count);
  }
LAB_002e3d0b:
  if (1 < pIVar10->Count) {
    ImDrawListSplitter::Split(&pIVar10->Splitter,window->DrawList,pIVar10->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar10->Splitter,window->DrawList,1);
    pIVar12 = (((GImGui->CurrentWindow->DC).CurrentColumns)->Columns).Data;
    PushClipRect(&(pIVar12->ClipRect).Min,&(pIVar12->ClipRect).Max,false);
  }
  fVar17 = 0.0;
  fVar19 = 0.0;
  pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar2 != (ImGuiOldColumns *)0x0) {
    iVar13 = pIVar10->Current;
    iVar16 = iVar13;
    if (iVar13 < 0) {
      iVar16 = pIVar2->Current;
    }
    fVar19 = pIVar2->OffMinX;
    pIVar12 = (pIVar2->Columns).Data;
    if (iVar13 < -1) {
      iVar13 = pIVar2->Current;
    }
    else {
      iVar13 = iVar13 + 1;
    }
    auVar18 = ZEXT416((uint)(pIVar2->OffMaxX - fVar19));
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)pIVar12[iVar16].OffsetNorm),auVar18,ZEXT416((uint)fVar19)
                            );
    fVar17 = auVar3._0_4_;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)fVar19),auVar18,ZEXT416((uint)pIVar12[iVar13].OffsetNorm)
                            );
    fVar19 = auVar3._0_4_;
  }
  PushItemWidth((fVar19 - fVar17) * 0.65);
  fVar4 = fVar1 - (window->WindowPadding).x;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT416(0),0xd);
  fVar4 = (float)((uint)((byte)uVar5 & 1) * (int)fVar4);
  (window->DC).ColumnsOffset.x = fVar4;
  fVar17 = (window->Pos).x;
  auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar4 + fVar17 + (window->DC).Indent.x)));
  (window->DC).CursorPos.x = auVar3._0_4_;
  (window->WorkRect).Max.x = (fVar17 + fVar19) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}